

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkDarLatchSweep
          (Abc_Ntk_t *pNtk,int fLatchConst,int fLatchEqual,int fSaveNames,int fUseMvSweep,
          int nFramesSymb,int nFramesSatur,int fVerbose,int fVeryVerbose)

{
  Aig_Man_t *pAig;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  int nFramesSymb_local;
  int fUseMvSweep_local;
  int fSaveNames_local;
  int fLatchEqual_local;
  int fLatchConst_local;
  Abc_Ntk_t *pNtk_local;
  
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig == (Aig_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    if (fSaveNames == 0) {
      if (pAig->vFlopNums != (Vec_Int_t *)0x0) {
        Vec_IntFree(pAig->vFlopNums);
      }
      pAig->vFlopNums = (Vec_Int_t *)0x0;
      pTemp = Aig_ManScl(pAig,fLatchConst,fLatchEqual,fUseMvSweep,nFramesSymb,nFramesSatur,fVerbose,
                         fVeryVerbose);
      Aig_ManStop(pAig);
    }
    else {
      Aig_ManSeqCleanup(pAig);
      pTemp = pAig;
      if ((fLatchConst != 0) && (pAig->nRegs != 0)) {
        pTemp = Aig_ManConstReduce(pAig,fUseMvSweep,nFramesSymb,nFramesSatur,fVerbose,fVeryVerbose);
      }
      if ((fLatchEqual != 0) && (pTemp->nRegs != 0)) {
        pTemp = Aig_ManReduceLaches(pTemp,fVerbose);
      }
    }
    pNtk_local = Abc_NtkFromDarSeqSweep(pNtk,pTemp);
    Aig_ManStop(pTemp);
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarLatchSweep( Abc_Ntk_t * pNtk, int fLatchConst, int fLatchEqual, int fSaveNames, int fUseMvSweep, int nFramesSymb, int nFramesSatur, int fVerbose, int fVeryVerbose )
{
    extern void Aig_ManPrintControlFanouts( Aig_Man_t * p );
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    if ( fSaveNames )
    {
        Aig_ManSeqCleanup( pMan );
        if ( fLatchConst && pMan->nRegs )
            pMan = Aig_ManConstReduce( pMan, fUseMvSweep, nFramesSymb, nFramesSatur, fVerbose, fVeryVerbose );
        if ( fLatchEqual && pMan->nRegs )
            pMan = Aig_ManReduceLaches( pMan, fVerbose );
    }
    else
    {
        if ( pMan->vFlopNums )
            Vec_IntFree( pMan->vFlopNums );
        pMan->vFlopNums = NULL;
        pMan = Aig_ManScl( pTemp = pMan, fLatchConst, fLatchEqual, fUseMvSweep, nFramesSymb, nFramesSatur, fVerbose, fVeryVerbose );
        Aig_ManStop( pTemp );
    }

    pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pMan );
//Aig_ManPrintControlFanouts( pMan );
    Aig_ManStop( pMan );
    return pNtkAig;
}